

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn3s.hpp
# Opt level: O2

void __thiscall trng::yarn3s::jump2(yarn3s *this,uint s)

{
  uint uVar1;
  int32_t (*a) [9];
  result_type d [3];
  result_type c [9];
  int32_t local_a8 [2];
  int local_a0;
  int32_t local_98 [2];
  int local_90;
  int32_t local_88 [12];
  int32_t local_58 [2];
  int local_50;
  int32_t local_4c [9];
  
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[6] = 0;
  local_88[7] = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[8] = 0;
  local_58 = *(int32_t (*) [2])(this->P).a;
  local_50 = (this->P).a[2];
  local_4c[0] = 1;
  local_4c[1] = 0;
  local_4c[2] = 0;
  local_4c[3] = 0;
  local_4c[4] = 1;
  local_4c[5] = 0;
  for (uVar1 = 0; uVar1 < s; uVar1 = uVar1 + 2) {
    int_math::matrix_mult<3>
              ((int32_t (*) [9])local_58,(int32_t (*) [9])local_58,(int32_t (*) [9])local_88,
               0x7fffadb3);
    if (s <= uVar1 + 1) break;
    int_math::matrix_mult<3>
              ((int32_t (*) [9])local_88,(int32_t (*) [9])local_88,(int32_t (*) [9])local_58,
               0x7fffadb3);
  }
  local_98 = *(int32_t (*) [2])(this->S).r;
  local_90 = (this->S).r[2];
  a = (int32_t (*) [9])local_88;
  if ((s & 1) == 0) {
    a = (int32_t (*) [9])local_58;
  }
  int_math::matrix_vec_mult<3>(a,(int32_t (*) [3])local_98,(int32_t (*) [3])local_a8,0x7fffadb3);
  *(int32_t (*) [2])(this->S).r = local_a8;
  (this->S).r[2] = local_a0;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn3s::jump2(unsigned int s) {
    result_type b[9], c[9]{};
    b[0] = P.a[0];
    b[1] = P.a[1];
    b[2] = P.a[2];
    b[3] = 1;
    b[4] = 0;
    b[5] = 0;
    b[6] = 0;
    b[7] = 1;
    b[8] = 0;
    for (unsigned int i{0}; i < s; ++i) {
      int_math::matrix_mult<3>(b, b, c, modulus);
      ++i;
      if (not(i < s))
        break;
      int_math::matrix_mult<3>(c, c, b, modulus);
    }
    const result_type r[3]{S.r[0], S.r[1], S.r[2]};
    result_type d[3];
    if ((s & 1u) == 0)
      int_math::matrix_vec_mult<3>(b, r, d, modulus);
    else
      int_math::matrix_vec_mult<3>(c, r, d, modulus);
    S.r[0] = d[0];
    S.r[1] = d[1];
    S.r[2] = d[2];
  }